

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::BoundAggregateExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundAggregateExpression *this)

{
  uint in_stack_ffffffffffffff94;
  bool in_stack_ffffffffffffffa0;
  string local_58;
  _func_int **local_38;
  ExpressionType local_30;
  ExpressionClass EStack_2f;
  undefined6 uStack_2e;
  undefined1 local_28;
  
  local_30 = INVALID;
  EStack_2f = INVALID;
  uStack_2e = 0;
  local_28 = 0;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = (_func_int **)&stack0xffffffffffffffd8;
  FunctionExpression::
  ToString<duckdb::BoundAggregateExpression,duckdb::Expression,duckdb::BoundOrderModifier>
            (__return_storage_ptr__,(FunctionExpression *)this,
             (BoundAggregateExpression *)&stack0xffffffffffffffc8,&local_58,
             &(this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name,
             (string *)0x0,this->aggr_type == DISTINCT,
             SUB81((this->filter).
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,0),
             (Expression *)
             (this->order_bys).
             super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
             .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl,
             (BoundOrderModifier *)((ulong)in_stack_ffffffffffffff94 << 0x20),false,
             in_stack_ffffffffffffffa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != (_func_int **)&stack0xffffffffffffffd8) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundAggregateExpression::ToString() const {
	return FunctionExpression::ToString<BoundAggregateExpression, Expression, BoundOrderModifier>(
	    *this, string(), string(), function.name, false, IsDistinct(), filter.get(), order_bys.get());
}